

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.cpp
# Opt level: O0

uchar char_name_to_char(string *name)

{
  long lVar1;
  uchar *puVar2;
  size_type sVar3;
  string local_58;
  string local_38;
  string *local_18;
  string *name_local;
  
  local_18 = name;
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 1) {
    puVar2 = (uchar *)std::__cxx11::string::operator[]((ulong)name);
    name_local._7_1_ = *puVar2;
  }
  else {
    std::__cxx11::string::string((string *)&local_58,(string *)name);
    normalize_char_name(&local_38,&local_58);
    std::__cxx11::string::operator=((string *)name,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
            ::count(&charnames_abi_cxx11_,name);
    if (sVar3 == 0) {
      name_local._7_1_ = '\0';
    }
    else {
      puVar2 = (uchar *)std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
                        ::at(&charnames_abi_cxx11_,name);
      name_local._7_1_ = *puVar2;
    }
  }
  return name_local._7_1_;
}

Assistant:

unsigned char char_name_to_char(std::string name)
{
    if(name.length() == 1)
        return name[0];
    name = normalize_char_name(name);
    if(charnames.count(name))
        return charnames.at(name);
    return 0;
}